

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

FLOW_HANDLE flow_clone(FLOW_HANDLE value)

{
  FLOW_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (FLOW_HANDLE)malloc(8);
  if (__ptr != (FLOW_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (FLOW_HANDLE)0x0;
}

Assistant:

FLOW_HANDLE flow_clone(FLOW_HANDLE value)
{
    FLOW_INSTANCE* flow_instance = (FLOW_INSTANCE*)malloc(sizeof(FLOW_INSTANCE));
    if (flow_instance != NULL)
    {
        flow_instance->composite_value = amqpvalue_clone(((FLOW_INSTANCE*)value)->composite_value);
        if (flow_instance->composite_value == NULL)
        {
            free(flow_instance);
            flow_instance = NULL;
        }
    }

    return flow_instance;
}